

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O0

int QFileSystemEngine::rmdir(char *__path)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int *piVar4;
  char *__path_00;
  long in_FS_OFFSET;
  undefined1 uVar5;
  QByteArray path;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QFileSystemEntry::nativeFilePath
            ((QFileSystemEntry *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  bVar2 = QByteArray::isEmpty((QByteArray *)0x16ddd8);
  if (bVar2) {
    piVar4 = __errno_location();
    *piVar4 = 0x16;
    uVar5 = false;
  }
  else {
    bVar2 = qIsFilenameBroken((QByteArray *)0x16de32);
    if (bVar2) {
      piVar4 = __errno_location();
      *piVar4 = 0x16;
      uVar5 = false;
    }
    else {
      __path_00 = QByteArray::constData((QByteArray *)0x16de8d);
      iVar3 = ::rmdir(__path_00);
      uVar5 = iVar3 == 0;
    }
  }
  QByteArray::~QByteArray((QByteArray *)0x16deb3);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (uint)CONCAT71((int7)((ulong)*(long *)(in_FS_OFFSET + 0x28) >> 8),uVar5) & 0xffffff01;
}

Assistant:

bool QFileSystemEngine::rmdir(const QFileSystemEntry &entry)
{
    const QByteArray path = entry.nativeFilePath();
    Q_CHECK_FILE_NAME(path, false);
    return ::rmdir(path.constData()) == 0;
}